

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmfilegen.cpp
# Opt level: O3

void usage(FILE *stream)

{
  fprintf((FILE *)stream,
          "USAGE: %s [-c <file-size>] [-v] <output-file>\n\n       %s [-o <fwd|rev|rand>] [-v] <input-file>\n\n       %s [-w <output-file>] [-v] <input-file>\n\n       %s [-h|-help] [-V]\n\n  -c <file-size>     - Create test file containing <file-size> megabytes of data\n  -h | -help         - Show help\n  -o <fwd|rev|rand>  - Specify order used when validating a file.\n                       One of fwd|rev|rand, default is rand\n  -v                 - Verbose. Prints informative messages to stderr\n  -V                 - Show version information\n  -w <output-file>   - Read-Validate-Write - file is written to <output-file>\n                       (sequential read only)\n\n  NOTES: o There is no option grouping, all options must be distinct arguments.\n         o All option arguments must be separated from the option by whitespace.\n\n"
          ,"kmfilegen","kmfilegen","kmfilegen","kmfilegen");
  return;
}

Assistant:

void
usage(FILE* stream = stdout)
{
  fprintf(stream, "\
USAGE: %s [-c <file-size>] [-v] <output-file>\n\
\n\
       %s [-o <fwd|rev|rand>] [-v] <input-file>\n\
\n\
       %s [-w <output-file>] [-v] <input-file>\n\
\n\
       %s [-h|-help] [-V]\n\
\n\
  -c <file-size>     - Create test file containing <file-size> megabytes of data\n\
  -h | -help         - Show help\n\
  -o <fwd|rev|rand>  - Specify order used when validating a file.\n\
                       One of fwd|rev|rand, default is rand\n\
  -v                 - Verbose. Prints informative messages to stderr\n\
  -V                 - Show version information\n\
  -w <output-file>   - Read-Validate-Write - file is written to <output-file>\n\
                       (sequential read only)\n\
\n\
  NOTES: o There is no option grouping, all options must be distinct arguments.\n\
         o All option arguments must be separated from the option by whitespace.\n\
\n", PROGRAM_NAME, PROGRAM_NAME, PROGRAM_NAME, PROGRAM_NAME);
}